

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

void __thiscall slang::ast::SystemTimingCheckSymbol::resolve(SystemTimingCheckSymbol *this)

{
  Scope *pSVar1;
  double dVar2;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  string_view arg;
  string_view arg_00;
  ulong uVar3;
  bool bVar4;
  int iVar6;
  Symbol *this_00;
  size_t sVar7;
  size_type sVar8;
  bool bVar5;
  undefined4 extraout_var;
  SVInt *this_01;
  ExpressionSyntax *pEVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type sVar10;
  pointer pvVar11;
  const_pointer pvVar12;
  undefined4 extraout_var_02;
  reference pAVar13;
  undefined4 extraout_var_03;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src_00;
  Symbol *in_RDI;
  float fVar14;
  LookupLocation LVar15;
  SourceRange SVar16;
  Token TVar17;
  string_view sVar18;
  string_view sVar19;
  string_view sVar20;
  Token TVar21;
  Expression *expr_5;
  ExpressionSyntax *exprSyntax_1;
  Expression *signalExpr;
  EdgeKind edge_1;
  EdgeDescriptor desc;
  string_view t2;
  string_view t1;
  EdgeDescriptorSyntax *descSyntax;
  iterator __end6;
  iterator __begin6;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *__range6;
  SmallVector<std::array<char,_2UL>,_20UL> edgeDescriptors;
  EdgeKind edge;
  Expression *condition;
  Expression *expr_4;
  TimingCheckEventArgSyntax *eventArg;
  Expression *expr_3;
  Expression *expr_2;
  ASTContext nonContinuous;
  ExpressionSyntax *exprSyntax;
  Expression *expr_1;
  ConstantValue val;
  Expression *expr;
  TimingCheckArgSyntax *actual;
  value_type *formal;
  size_t i;
  SmallVector<slang::ast::SystemTimingCheckSymbol::Arg,_2UL> argBuf;
  Diagnostic *diag_1;
  Diagnostic *diag;
  vector<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
  *formalArgs;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *actualArgs;
  SystemTimingCheckSyntax *syntax;
  ASTContext context;
  Compilation *comp;
  Scope *parentParent;
  Scope *parent;
  SyntaxNode *syntaxPtr;
  iterator_base<slang::syntax::EdgeDescriptorSyntax_*> *in_stack_fffffffffffff8f8;
  Diagnostic *in_stack_fffffffffffff900;
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *in_stack_fffffffffffff908;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff910;
  SourceLocation in_stack_fffffffffffff918;
  SourceLocation in_stack_fffffffffffff920;
  SourceLocation in_stack_fffffffffffff928;
  Diagnostic *in_stack_fffffffffffff930;
  Type *in_stack_fffffffffffff938;
  Diagnostic *in_stack_fffffffffffff940;
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *in_stack_fffffffffffff948;
  reference in_stack_fffffffffffff950;
  char *in_stack_fffffffffffff970;
  size_t in_stack_fffffffffffff978;
  Diagnostic *in_stack_fffffffffffff980;
  ASTContext *in_stack_fffffffffffff988;
  ExpressionTimingCheckArgSyntax *in_stack_fffffffffffffa78;
  ASTContext *in_stack_fffffffffffffa80;
  SourceLocation in_stack_fffffffffffffa88;
  Info *in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  size_t local_410;
  char *local_408;
  Token local_400;
  SourceLocation local_3f0;
  Diagnostic *local_3e8;
  Diagnostic *local_3e0;
  Expression *local_3d8;
  SourceRange local_3d0;
  undefined4 local_3bc;
  string_view local_3b8;
  SourceLocation local_3a8;
  SourceLocation SStack_3a0;
  undefined4 local_390;
  EdgeKind local_38c;
  undefined8 local_388;
  size_t local_370;
  Expression *in_stack_fffffffffffffc98;
  size_t in_stack_fffffffffffffca0;
  char *in_stack_fffffffffffffca8;
  SmallVectorBase<std::array<char,_2UL>_> local_320 [2];
  EdgeKind local_2dc;
  bitmask<slang::ast::ASTFlags> local_2d8;
  undefined8 local_2d0;
  Expression *local_2c8;
  TimingCheckEventArgSyntax *local_2c0;
  Expression *local_2b8;
  Token local_2b0;
  SourceLocation local_2a0;
  ASTContext *local_298;
  bitmask<slang::ast::ASTFlags> local_290;
  sockaddr local_288;
  bitmask<slang::ast::ASTFlags> local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  SourceRange local_248;
  undefined4 local_234;
  ExpressionSyntax *local_230;
  bitmask<slang::ast::ASTFlags> local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_208;
  shortreal_t local_204;
  real_t local_200;
  bitmask<slang::ast::EvalFlags> local_1f1 [41];
  bitmask<slang::ast::ASTFlags> local_1c8;
  long local_1c0;
  SourceRange local_1b8;
  undefined4 local_1a4;
  SourceRange local_1a0;
  undefined4 local_190;
  SyntaxNode *local_180;
  const_reference local_178;
  ulong local_170;
  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> local_168;
  string_view local_100;
  SourceRange local_f0;
  undefined4 local_dc;
  Diagnostic *local_d8;
  string_view local_d0;
  SourceRange local_c0;
  undefined4 local_ac;
  Diagnostic *local_a8;
  vector<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
  *local_a0;
  SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *local_98;
  SystemTimingCheckSyntax *local_90;
  underlying_type local_88;
  Scope *local_80;
  uint32_t local_78;
  Scope *local_70;
  uint32_t local_68;
  sockaddr local_60;
  underlying_type local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  Compilation *local_28;
  Scope *local_20;
  Scope *local_18;
  SyntaxNode *local_10;
  
  in_RDI[1].field_0x4 = 1;
  if (in_RDI[1].location != (SourceLocation)0x0) {
    local_10 = Symbol::getSyntax(in_RDI);
    local_18 = Symbol::getParentScope(in_RDI);
    this_00 = Scope::asSymbol(local_18);
    local_20 = Symbol::getParentScope(this_00);
    local_28 = Scope::getCompilation(local_18);
    LVar15 = LookupLocation::after((Symbol *)in_stack_fffffffffffff900);
    local_80 = LVar15.scope;
    local_78 = LVar15.index;
    local_70 = local_80;
    local_68 = local_78;
    local_88 = (underlying_type)
               ast::operator|((ASTFlags)in_stack_fffffffffffff908,
                              (ASTFlags)in_stack_fffffffffffff900);
    LVar15._8_8_ = in_stack_fffffffffffff920;
    LVar15.scope = (Scope *)in_stack_fffffffffffff918;
    ASTContext::ASTContext
              ((ASTContext *)in_stack_fffffffffffff908,(Scope *)in_stack_fffffffffffff900,LVar15,
               in_stack_fffffffffffff910);
    local_90 = slang::syntax::SyntaxNode::as<slang::syntax::SystemTimingCheckSyntax>(local_10);
    local_98 = &local_90->args;
    local_a0 = (vector<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                *)((long)in_RDI[1].location + 0x10);
    sVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::size
                      ((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)0x52cee0);
    if (sVar7 < *(ulong *)((long)in_RDI[1].location + 8)) {
      local_ac = 0x9f0007;
      local_c0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff950);
      sourceRange.endLoc = in_stack_fffffffffffff928;
      sourceRange.startLoc = in_stack_fffffffffffff920;
      local_a8 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff918,
                                     SUB84((ulong)in_stack_fffffffffffff930 >> 0x20,0),sourceRange);
      local_d0 = parsing::Token::valueText((Token *)in_stack_fffffffffffff910.m_bits);
      arg._M_str = (char *)in_stack_fffffffffffff950;
      arg._M_len = (size_t)in_stack_fffffffffffff948;
      Diagnostic::operator<<(in_stack_fffffffffffff940,arg);
      Diagnostic::operator<<<unsigned_long>
                ((Diagnostic *)in_stack_fffffffffffff910.m_bits,
                 (unsigned_long)in_stack_fffffffffffff908);
      slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::size
                ((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)0x52cfcc);
      Diagnostic::operator<<<unsigned_long>
                ((Diagnostic *)in_stack_fffffffffffff910.m_bits,
                 (unsigned_long)in_stack_fffffffffffff908);
    }
    else {
      sVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::size
                        ((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)0x52cfee);
      sVar8 = std::
              vector<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
              ::size(local_a0);
      if (sVar8 < sVar7) {
        local_dc = 0xa00007;
        local_f0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff950);
        sourceRange_00.endLoc = in_stack_fffffffffffff928;
        sourceRange_00.startLoc = in_stack_fffffffffffff920;
        local_d8 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff918,
                                       SUB84((ulong)in_stack_fffffffffffff930 >> 0x20,0),
                                       sourceRange_00);
        local_100 = parsing::Token::valueText((Token *)in_stack_fffffffffffff910.m_bits);
        arg_00._M_str = (char *)in_stack_fffffffffffff950;
        arg_00._M_len = (size_t)in_stack_fffffffffffff948;
        Diagnostic::operator<<(in_stack_fffffffffffff940,arg_00);
        std::
        vector<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
        ::size(local_a0);
        Diagnostic::operator<<<unsigned_long>
                  ((Diagnostic *)in_stack_fffffffffffff910.m_bits,
                   (unsigned_long)in_stack_fffffffffffff908);
        slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::size
                  ((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)0x52d105);
        Diagnostic::operator<<<unsigned_long>
                  ((Diagnostic *)in_stack_fffffffffffff910.m_bits,
                   (unsigned_long)in_stack_fffffffffffff908);
      }
      else {
        SmallVector<slang::ast::SystemTimingCheckSymbol::Arg,_2UL>::SmallVector
                  ((SmallVector<slang::ast::SystemTimingCheckSymbol::Arg,_2UL> *)0x52d127);
        sVar18._M_str = in_stack_fffffffffffffca8;
        sVar18._M_len = in_stack_fffffffffffffca0;
        TVar17.info = in_stack_fffffffffffffa90;
        TVar17.kind = (short)in_stack_fffffffffffffa98;
        TVar17._2_1_ = (char)((ulong)in_stack_fffffffffffffa98 >> 0x10);
        TVar17.numFlags.raw = (char)((ulong)in_stack_fffffffffffffa98 >> 0x18);
        TVar17.rawLen = (int)((ulong)in_stack_fffffffffffffa98 >> 0x20);
        sVar20._M_str = in_stack_fffffffffffff970;
        sVar20._M_len = in_stack_fffffffffffff978;
        TVar21.info = (Info *)in_stack_fffffffffffff920;
        TVar21._0_8_ = in_stack_fffffffffffff928;
        local_170 = 0;
        while( true ) {
          uVar3 = local_170;
          sVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::size
                            ((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)0x52d150);
          if (sVar7 <= uVar3) break;
          local_178 = std::
                      vector<slang::ast::SystemTimingCheckArgDef,_std::allocator<slang::ast::SystemTimingCheckArgDef>_>
                      ::operator[](local_a0,local_170);
          local_180 = &slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::
                       operator[]((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)
                                  in_stack_fffffffffffff900,(size_t)in_stack_fffffffffffff8f8)->
                       super_SyntaxNode;
          if (local_180->kind == EmptyTimingCheckArg) {
            if (local_170 < *(ulong *)((long)in_RDI[1].location + 8)) {
              local_190 = 0x4d0007;
              slang::syntax::SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax>::operator[]
                        ((SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)
                         in_stack_fffffffffffff900,(size_t)in_stack_fffffffffffff8f8);
              SVar16 = slang::syntax::SyntaxNode::sourceRange
                                 ((SyntaxNode *)in_stack_fffffffffffff950);
              sourceRange_01.endLoc = TVar21._0_8_;
              sourceRange_01.startLoc = (SourceLocation)TVar21.info;
              local_1a0 = SVar16;
              ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff918,
                                  SUB84((ulong)in_stack_fffffffffffff930 >> 0x20,0),sourceRange_01);
            }
            SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                      (in_stack_fffffffffffff908);
          }
          else if ((local_180->kind == TimingCheckEventArg) && (local_178->kind != Event)) {
            local_1a4 = 0xc60006;
            SVar16 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff950)
            ;
            sourceRange_02.endLoc = TVar21._0_8_;
            sourceRange_02.startLoc = (SourceLocation)TVar21.info;
            local_1b8 = SVar16;
            ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff918,
                                SUB84((ulong)in_stack_fffffffffffff930 >> 0x20,0),sourceRange_02);
            SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                      (in_stack_fffffffffffff908);
          }
          else {
            switch(local_178->kind) {
            case Event:
              if (local_180->kind == ExpressionTimingCheckArg) {
                in_stack_fffffffffffffa78 =
                     slang::syntax::SyntaxNode::as<slang::syntax::ExpressionTimingCheckArgSyntax>
                               (local_180);
                not_null<slang::syntax::ExpressionSyntax_*>::operator*
                          ((not_null<slang::syntax::ExpressionSyntax_*> *)0x52da29);
                local_2b8 = bindTerminal((ExpressionSyntax *)in_stack_fffffffffffff988,
                                         (SpecifyTerminalDir)
                                         ((ulong)in_stack_fffffffffffff980 >> 0x20),
                                         (Scope *)sVar20._M_len,(ASTContext *)sVar20._M_str);
                if (local_2b8 == (Expression *)0x0) {
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                            (in_stack_fffffffffffff908);
                }
                else {
                  SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                  emplace_back<slang::ast::Expression_const&>
                            (in_stack_fffffffffffff908,(Expression *)in_stack_fffffffffffff900);
                }
              }
              else {
                local_2c0 = slang::syntax::SyntaxNode::as<slang::syntax::TimingCheckEventArgSyntax>
                                      (local_180);
                not_null<slang::syntax::ExpressionSyntax_*>::operator*
                          ((not_null<slang::syntax::ExpressionSyntax_*> *)0x52dae1);
                local_2c8 = bindTerminal((ExpressionSyntax *)in_stack_fffffffffffff988,
                                         (SpecifyTerminalDir)
                                         ((ulong)in_stack_fffffffffffff980 >> 0x20),
                                         (Scope *)sVar20._M_len,(ASTContext *)sVar20._M_str);
                local_2d0 = 0;
                if (local_2c0->condition != (TimingCheckEventConditionSyntax *)0x0) {
                  pEVar9 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x52db5b);
                  bitmask<slang::ast::ASTFlags>::bitmask(&local_2d8,None);
                  iVar6 = Expression::bind((int)pEVar9,&local_60,(socklen_t)local_2d8.m_bits);
                  local_2d0 = CONCAT44(extraout_var_01,iVar6);
                  ASTContext::requireBooleanConvertible
                            (in_stack_fffffffffffff988,(Expression *)in_stack_fffffffffffff980);
                }
                local_2dc = SemanticFacts::getEdgeKind((local_2c0->edge).kind);
                SmallVector<std::array<char,_2UL>,_20UL>::SmallVector
                          ((SmallVector<std::array<char,_2UL>,_20UL> *)0x52dbfb);
                src_00 = extraout_RDX;
                if (local_2c0->controlSpecifier != (EdgeControlSpecifierSyntax *)0x0) {
                  slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::begin
                            ((SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *)0x52dc33);
                  slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::end
                            ((SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *)
                             in_stack_fffffffffffff900);
                  while( true ) {
                    bVar4 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>_>
                                      ((self_type *)in_stack_fffffffffffff900,
                                       in_stack_fffffffffffff8f8);
                    src_00 = extraout_RDX_00;
                    if (((bVar4 ^ 0xffU) & 1) == 0) break;
                    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>,_false>
                    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>,_false>
                                 *)0x52dce1);
                    sVar18 = parsing::Token::rawText((Token *)in_stack_fffffffffffff910.m_bits);
                    sVar19 = parsing::Token::rawText((Token *)in_stack_fffffffffffff910.m_bits);
                    in_stack_fffffffffffffc98 = (Expression *)sVar19._M_str;
                    local_370 = sVar19._M_len;
                    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::length
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &stack0xfffffffffffffca0);
                    sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::length
                                       ((basic_string_view<char,_std::char_traits<char>_> *)
                                        &local_370);
                    if (sVar8 + sVar10 == 2) {
                      pvVar11 = std::array<char,_2UL>::data((array<char,_2UL> *)0x52ddef);
                      pvVar12 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                          ((basic_string_view<char,_std::char_traits<char>_> *)
                                           &stack0xfffffffffffffca0);
                      sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::length
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         &stack0xfffffffffffffca0);
                      memcpy(pvVar11,pvVar12,sVar8);
                      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         &local_370);
                      if (!bVar4) {
                        pvVar11 = std::array<char,_2UL>::data((array<char,_2UL> *)0x52de4f);
                        sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::length
                                          ((basic_string_view<char,_std::char_traits<char>_> *)
                                           &stack0xfffffffffffffca0);
                        pvVar12 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                            ((basic_string_view<char,_std::char_traits<char>_> *)
                                             &local_370);
                        sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::length
                                           ((basic_string_view<char,_std::char_traits<char>_> *)
                                            &local_370);
                        memcpy(pvVar11 + sVar8,pvVar12,sVar10);
                      }
                      SmallVectorBase<std::array<char,_2UL>_>::push_back
                                ((SmallVectorBase<std::array<char,_2UL>_> *)
                                 in_stack_fffffffffffff900,
                                 (array<char,_2UL> *)in_stack_fffffffffffff8f8);
                    }
                    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>,_false>
                    ::
                    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>_>
                              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::iterator_base<slang::syntax::EdgeDescriptorSyntax_*>,_false>
                                *)in_stack_fffffffffffff900);
                  }
                }
                iVar6 = SmallVectorBase<std::array<char,_2UL>_>::copy
                                  (local_320,(EVP_PKEY_CTX *)local_28,src_00);
                local_388 = CONCAT44(extraout_var_02,iVar6);
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::EdgeKind&,std::span<std::array<char,2ul>,18446744073709551615ul>>
                          (in_stack_fffffffffffff948,(Expression *)in_stack_fffffffffffff940,
                           (Expression **)in_stack_fffffffffffff938,
                           (EdgeKind *)in_stack_fffffffffffff930,TVar21._0_8_);
                SmallVector<std::array<char,_2UL>,_20UL>::~SmallVector
                          ((SmallVector<std::array<char,_2UL>,_20UL> *)0x52df76);
              }
              if ((local_178->requireEdge & 1U) != 0) {
                pAVar13 = SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::back
                                    (&local_168);
                if (pAVar13->expr != (Expression *)0x0) {
                  pAVar13 = SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::back
                                      (&local_168);
                  local_38c = pAVar13->edge;
                  if (local_38c == None) {
                    local_390 = 0xc50006;
                    in_stack_fffffffffffff988 =
                         (ASTContext *)
                         SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::back(&local_168)
                    ;
                    pSVar1 = (in_stack_fffffffffffff988->scope).ptr;
                    local_3a8 = ((SourceRange *)&pSVar1->lastMember)->startLoc;
                    SStack_3a0 = *(SourceLocation *)&pSVar1->deferredMemberIndex;
                    sourceRange_04.endLoc = TVar21._0_8_;
                    sourceRange_04.startLoc = (SourceLocation)TVar21.info;
                    in_stack_fffffffffffff980 =
                         ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff918,
                                             SUB84((ulong)in_stack_fffffffffffff930 >> 0x20,0),
                                             sourceRange_04);
                    sVar20 = parsing::Token::valueText((Token *)in_stack_fffffffffffff910.m_bits);
                    sVar19._M_str = (char *)in_stack_fffffffffffff950;
                    sVar19._M_len = (size_t)in_stack_fffffffffffff948;
                    local_3b8 = sVar20;
                    Diagnostic::operator<<(in_stack_fffffffffffff940,sVar19);
                  }
                  else if ((*(int *)in_RDI[1].location == 0xc) && (local_38c == BothEdges)) {
                    local_3bc = 0x8a0006;
                    slang::syntax::SyntaxNode::as<slang::syntax::TimingCheckEventArgSyntax>
                              (local_180);
                    SVar16 = parsing::Token::range((Token *)TVar21.info);
                    sourceRange_05.endLoc = TVar21._0_8_;
                    sourceRange_05.startLoc = (SourceLocation)TVar21.info;
                    local_3d0 = SVar16;
                    ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff918,
                                        SUB84((ulong)in_stack_fffffffffffff930 >> 0x20,0),
                                        sourceRange_05);
                  }
                }
              }
              break;
            case Notifier:
              slang::syntax::SyntaxNode::as<slang::syntax::ExpressionTimingCheckArgSyntax>
                        (local_180);
              local_230 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                                    ((not_null<slang::syntax::ExpressionSyntax_*> *)0x52d7d9);
              if ((local_230->super_SyntaxNode).kind == IdentifierName) {
                local_258 = local_30;
                local_268 = local_40;
                uStack_260 = uStack_38;
                local_278.m_bits = local_50;
                uStack_270 = uStack_48;
                local_288.sa_family = local_60.sa_family;
                local_288.sa_data[0] = local_60.sa_data[0];
                local_288.sa_data[1] = local_60.sa_data[1];
                local_288.sa_data[2] = local_60.sa_data[2];
                local_288.sa_data[3] = local_60.sa_data[3];
                local_288.sa_data[4] = local_60.sa_data[4];
                local_288.sa_data[5] = local_60.sa_data[5];
                local_288.sa_data[6] = local_60.sa_data[6];
                local_288.sa_data[7] = local_60.sa_data[7];
                local_288.sa_data[8] = local_60.sa_data[8];
                local_288.sa_data[9] = local_60.sa_data[9];
                local_288.sa_data[10] = local_60.sa_data[10];
                local_288.sa_data[0xb] = local_60.sa_data[0xb];
                local_288.sa_data[0xc] = local_60.sa_data[0xc];
                local_288.sa_data[0xd] = local_60.sa_data[0xd];
                local_290 = ast::operator~((ASTFlags)in_stack_fffffffffffff8f8);
                bitmask<slang::ast::ASTFlags>::operator&=(&local_278,&local_290);
                Compilation::getLogicType(local_28);
                TVar17 = slang::syntax::SyntaxNode::getFirstToken
                                   ((SyntaxNode *)in_stack_fffffffffffff930);
                local_2b0 = TVar17;
                in_stack_fffffffffffffa88 = parsing::Token::location(&local_2b0);
                local_2a0 = in_stack_fffffffffffffa88;
                in_stack_fffffffffffffa80 =
                     (ASTContext *)
                     Expression::bindLValue
                               ((ExpressionSyntax *)TVar17.info,(Type *)in_stack_fffffffffffffa88,
                                TVar17._0_8_,in_stack_fffffffffffffa80,
                                SUB81((ulong)in_stack_fffffffffffffa78 >> 0x38,0));
                local_298 = in_stack_fffffffffffffa80;
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&>
                          (in_stack_fffffffffffff908,(Expression *)in_stack_fffffffffffff900);
              }
              else {
                local_234 = 0x680006;
                SVar16 = slang::syntax::SyntaxNode::sourceRange
                                   ((SyntaxNode *)in_stack_fffffffffffff950);
                sourceRange_03.endLoc = TVar21._0_8_;
                sourceRange_03.startLoc = (SourceLocation)TVar21.info;
                local_248 = SVar16;
                ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff918,
                                    SUB84((ulong)in_stack_fffffffffffff930 >> 0x20,0),sourceRange_03
                                   );
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                          (in_stack_fffffffffffff908);
              }
              break;
            case DelayedRef:
              in_stack_fffffffffffff950 =
                   SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::operator[]
                             (&local_168,(long)local_178->signalRef);
              local_3d8 = in_stack_fffffffffffff950->expr;
              if (local_3d8 == (Expression *)0x0) {
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::emplace_back<>
                          (in_stack_fffffffffffff908);
              }
              else {
                in_stack_fffffffffffff948 =
                     (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *)
                     slang::syntax::SyntaxNode::as<slang::syntax::ExpressionTimingCheckArgSyntax>
                               (local_180);
                in_stack_fffffffffffff930 =
                     (Diagnostic *)
                     not_null<slang::syntax::ExpressionSyntax_*>::operator*
                               ((not_null<slang::syntax::ExpressionSyntax_*> *)0x52e1ca);
                in_stack_fffffffffffff940 = in_stack_fffffffffffff930;
                local_3e0 = in_stack_fffffffffffff930;
                in_stack_fffffffffffff938 =
                     not_null<const_slang::ast::Type_*>::operator*
                               ((not_null<const_slang::ast::Type_*> *)0x52e1fc);
                TVar21 = slang::syntax::SyntaxNode::getFirstToken
                                   ((SyntaxNode *)in_stack_fffffffffffff930);
                local_400 = TVar21;
                in_stack_fffffffffffff918 = parsing::Token::location(&local_400);
                local_3f0 = in_stack_fffffffffffff918;
                in_stack_fffffffffffff910.m_bits =
                     (underlying_type)
                     Expression::bindLValue
                               ((ExpressionSyntax *)TVar17.info,(Type *)in_stack_fffffffffffffa88,
                                TVar17._0_8_,in_stack_fffffffffffffa80,
                                SUB81((ulong)in_stack_fffffffffffffa78 >> 0x38,0));
                local_3e8 = (Diagnostic *)in_stack_fffffffffffff910.m_bits;
                SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
                emplace_back<slang::ast::Expression_const&>
                          (in_stack_fffffffffffff908,(Expression *)in_stack_fffffffffffff900);
              }
              break;
            case Limit:
              slang::syntax::SyntaxNode::as<slang::syntax::ExpressionTimingCheckArgSyntax>
                        (local_180);
              pEVar9 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                                 ((not_null<slang::syntax::ExpressionSyntax_*> *)0x52d3a5);
              bitmask<slang::ast::ASTFlags>::bitmask(&local_1c8,None);
              iVar6 = Expression::bind((int)pEVar9,&local_60,(socklen_t)local_1c8.m_bits);
              local_1c0 = CONCAT44(extraout_var,iVar6);
              SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
              emplace_back<slang::ast::Expression_const&>
                        (in_stack_fffffffffffff908,(Expression *)in_stack_fffffffffffff900);
              local_1f1[0].m_bits = '\0';
              bitmask<slang::ast::EvalFlags>::bitmask(local_1f1);
              ASTContext::eval((ASTContext *)sVar18._M_len,in_stack_fffffffffffffc98,
                               (bitmask<slang::ast::EvalFlags>)sVar18._M_str._7_1_);
              bVar4 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x52d467);
              if ((bVar4) && ((local_178->requirePositive & 1U) != 0)) {
                bVar4 = slang::ConstantValue::isInteger((ConstantValue *)0x52d49f);
                if (bVar4) {
                  this_01 = slang::ConstantValue::integer((ConstantValue *)0x52d4c5);
                  bVar4 = SVInt::isSigned(this_01);
                  if (!bVar4) goto LAB_0052d53a;
                  slang::ConstantValue::integer((ConstantValue *)0x52d4ff);
                  bVar5 = SVInt::isNegative((SVInt *)in_stack_fffffffffffff900);
                  bVar4 = true;
                  if (!bVar5) goto LAB_0052d53a;
                }
                else {
LAB_0052d53a:
                  bVar4 = slang::ConstantValue::isReal((ConstantValue *)0x52d547);
                  if (bVar4) {
                    local_200 = slang::ConstantValue::real
                                          ((ConstantValue *)in_stack_fffffffffffff8f8);
                    dVar2 = real_t::operator_cast_to_double(&local_200);
                    bVar4 = true;
                    if (dVar2 < 0.0) goto LAB_0052d654;
                  }
                  bVar5 = slang::ConstantValue::isShortReal((ConstantValue *)0x52d5cb);
                  bVar4 = false;
                  if (bVar5) {
                    local_204 = slang::ConstantValue::shortReal
                                          ((ConstantValue *)in_stack_fffffffffffff8f8);
                    fVar14 = shortreal_t::operator_cast_to_float(&local_204);
                    bVar4 = fVar14 < 0.0;
                  }
                }
LAB_0052d654:
                if (bVar4) {
                  local_208 = 0xca0007;
                  local_218 = *(undefined8 *)(local_1c0 + 0x20);
                  uStack_210 = *(undefined8 *)(local_1c0 + 0x28);
                  SVar16.endLoc = TVar21._0_8_;
                  SVar16.startLoc = (SourceLocation)TVar21.info;
                  ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff918,
                                      SUB84((ulong)in_stack_fffffffffffff930 >> 0x20,0),SVar16);
                  Diagnostic::operator<<
                            (in_stack_fffffffffffff900,(ConstantValue *)in_stack_fffffffffffff8f8);
                }
              }
              slang::ConstantValue::~ConstantValue((ConstantValue *)0x52d6ff);
              break;
            case Condition:
              slang::syntax::SyntaxNode::as<slang::syntax::ExpressionTimingCheckArgSyntax>
                        (local_180);
              pEVar9 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                                 ((not_null<slang::syntax::ExpressionSyntax_*> *)0x52d72c);
              bitmask<slang::ast::ASTFlags>::bitmask(&local_228,None);
              iVar6 = Expression::bind((int)pEVar9,&local_60,(socklen_t)local_228.m_bits);
              local_220 = CONCAT44(extraout_var_00,iVar6);
              ASTContext::requireBooleanConvertible
                        (in_stack_fffffffffffff988,(Expression *)in_stack_fffffffffffff980);
              SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
              emplace_back<slang::ast::Expression_const&>
                        (in_stack_fffffffffffff908,(Expression *)in_stack_fffffffffffff900);
            }
          }
          local_170 = local_170 + 1;
        }
        iVar6 = SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::copy
                          (&local_168,(EVP_PKEY_CTX *)local_28,src);
        std::span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>::
        span<slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL>
                  ((span<const_slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL> *)
                   in_stack_fffffffffffff910.m_bits,
                   (span<slang::ast::SystemTimingCheckSymbol::Arg,_18446744073709551615UL> *)
                   CONCAT44(extraout_var_03,iVar6));
        in_RDI[1].name._M_len = local_410;
        in_RDI[1].name._M_str = local_408;
        SmallVector<slang::ast::SystemTimingCheckSymbol::Arg,_2UL>::~SmallVector
                  ((SmallVector<slang::ast::SystemTimingCheckSymbol::Arg,_2UL> *)0x52e33e);
      }
    }
  }
  return;
}

Assistant:

void SystemTimingCheckSymbol::resolve() const {
    isResolved = true;
    if (!def)
        return;

    auto syntaxPtr = getSyntax();
    auto parent = getParentScope();
    SLANG_ASSERT(syntaxPtr && parent);

    auto parentParent = parent->asSymbol().getParentScope();
    auto& comp = parent->getCompilation();
    ASTContext context(*parent, LookupLocation::after(*this),
                       ASTFlags::NonProcedural | ASTFlags::SpecifyBlock);

    auto& syntax = syntaxPtr->as<SystemTimingCheckSyntax>();
    auto& actualArgs = syntax.args;
    auto& formalArgs = def->args;

    if (actualArgs.size() < def->minArgs) {
        auto& diag = context.addDiag(diag::TooFewArguments, syntax.sourceRange());
        diag << syntax.name.valueText();
        diag << def->minArgs << actualArgs.size();
        return;
    }

    if (actualArgs.size() > formalArgs.size()) {
        auto& diag = context.addDiag(diag::TooManyArguments, syntax.sourceRange());
        diag << syntax.name.valueText();
        diag << formalArgs.size();
        diag << actualArgs.size();
        return;
    }

    SmallVector<Arg> argBuf;
    for (size_t i = 0; i < actualArgs.size(); i++) {
        auto& formal = formalArgs[i];
        auto& actual = *actualArgs[i];
        if (actual.kind == SyntaxKind::EmptyTimingCheckArg) {
            if (i < def->minArgs)
                context.addDiag(diag::EmptyArgNotAllowed, actualArgs[i]->sourceRange());
            argBuf.emplace_back();
            continue;
        }

        if (actual.kind == SyntaxKind::TimingCheckEventArg &&
            formal.kind != SystemTimingCheckArgDef::Event) {
            context.addDiag(diag::TimingCheckEventNotAllowed, actual.sourceRange());
            argBuf.emplace_back();
            continue;
        }

        switch (formal.kind) {
            case SystemTimingCheckArgDef::Limit: {
                auto& expr = Expression::bind(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                              context);
                argBuf.emplace_back(expr);

                auto val = context.eval(expr);
                if (val && formal.requirePositive) {
                    if ((val.isInteger() && val.integer().isSigned() &&
                         val.integer().isNegative()) ||
                        (val.isReal() && val.real() < 0.0) ||
                        (val.isShortReal() && val.shortReal() < 0.0f)) {
                        context.addDiag(diag::NegativeTimingLimit, expr.sourceRange) << val;
                    }
                }
                break;
            }
            case SystemTimingCheckArgDef::Condition: {
                auto& expr = Expression::bind(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                              context);
                context.requireBooleanConvertible(expr);
                argBuf.emplace_back(expr);
                break;
            }
            case SystemTimingCheckArgDef::Notifier: {
                // Needs to be a simple identifier, referencing an integral lvalue
                auto& exprSyntax = *actual.as<ExpressionTimingCheckArgSyntax>().expr;
                if (exprSyntax.kind != SyntaxKind::IdentifierName) {
                    context.addDiag(diag::InvalidTimingCheckNotifierArg, actual.sourceRange());
                    argBuf.emplace_back();
                    break;
                }

                ASTContext nonContinuous = context;
                nonContinuous.flags &= ~ASTFlags::NonProcedural;

                auto& expr = Expression::bindLValue(exprSyntax, comp.getLogicType(),
                                                    exprSyntax.getFirstToken().location(),
                                                    nonContinuous, /* isInout */ false);
                argBuf.emplace_back(expr);
                break;
            }
            case SystemTimingCheckArgDef::Event:
                if (actual.kind == SyntaxKind::ExpressionTimingCheckArg) {
                    auto expr = bindTerminal(*actual.as<ExpressionTimingCheckArgSyntax>().expr,
                                             SpecifyBlockSymbol::SpecifyTerminalDir::Both,
                                             parentParent, context);
                    if (!expr)
                        argBuf.emplace_back();
                    else
                        argBuf.emplace_back(*expr);
                }
                else {
                    auto& eventArg = actual.as<TimingCheckEventArgSyntax>();
                    auto expr = bindTerminal(*eventArg.terminal,
                                             SpecifyBlockSymbol::SpecifyTerminalDir::Both,
                                             parentParent, context);

                    const Expression* condition = nullptr;
                    if (eventArg.condition) {
                        condition = &Expression::bind(*eventArg.condition->expr, context);
                        context.requireBooleanConvertible(*condition);
                    }

                    auto edge = SemanticFacts::getEdgeKind(eventArg.edge.kind);

                    SmallVector<EdgeDescriptor> edgeDescriptors;
                    if (eventArg.controlSpecifier) {
                        for (auto descSyntax : eventArg.controlSpecifier->descriptors) {
                            auto t1 = descSyntax->t1.rawText();
                            auto t2 = descSyntax->t2.rawText();
                            if (t1.length() + t2.length() != 2)
                                continue;

                            EdgeDescriptor desc;
                            memcpy(desc.data(), t1.data(), t1.length());
                            if (!t2.empty())
                                memcpy(desc.data() + t1.length(), t2.data(), t2.length());

                            edgeDescriptors.push_back(desc);
                        }
                    }

                    argBuf.emplace_back(*expr, condition, edge, edgeDescriptors.copy(comp));
                }

                if (formal.requireEdge && argBuf.back().expr) {
                    auto edge = argBuf.back().edge;
                    if (edge == EdgeKind::None) {
                        context.addDiag(diag::TimingCheckEventEdgeRequired,
                                        argBuf.back().expr->sourceRange)
                            << syntax.name.valueText();
                    }
                    else if (def->kind == SystemTimingCheckKind::NoChange &&
                             edge == EdgeKind::BothEdges) {
                        context.addDiag(diag::NoChangeEdgeRequired,
                                        actual.as<TimingCheckEventArgSyntax>().edge.range());
                    }
                }
                break;
            case SystemTimingCheckArgDef::DelayedRef: {
                SLANG_ASSERT(formal.signalRef >= 0 && formal.signalRef < int(i));
                auto signalExpr = argBuf[size_t(formal.signalRef)].expr;
                if (!signalExpr) {
                    argBuf.emplace_back();
                    break;
                }

                auto& exprSyntax = *actual.as<ExpressionTimingCheckArgSyntax>().expr;
                auto& expr = Expression::bindLValue(exprSyntax, *signalExpr->type,
                                                    exprSyntax.getFirstToken().location(), context,
                                                    /* isInout */ false);
                argBuf.emplace_back(expr);
                break;
            }
        }
    }

    args = argBuf.copy(comp);
}